

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer.cc
# Opt level: O2

void prometheus::anon_unknown_3::WriteHead<double>
               (ostream *out,MetricFamily *family,ClientMetric *metric,string *suffix,
               string *extraLabelName,double *extraLabelValue)

{
  pointer pLVar1;
  ostream *poVar2;
  char *pcVar3;
  Label *lp;
  pointer pLVar4;
  
  poVar2 = std::operator<<(out,(string *)family);
  std::operator<<(poVar2,(string *)suffix);
  if (((metric->label).
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       (metric->label).
       super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
       ._M_impl.super__Vector_impl_data._M_finish) || (extraLabelName->_M_string_length != 0)) {
    std::operator<<(out,"{");
    pLVar1 = (metric->label).
             super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = "";
    for (pLVar4 = (metric->label).
                  super__Vector_base<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>
                  ._M_impl.super__Vector_impl_data._M_start; pLVar4 != pLVar1; pLVar4 = pLVar4 + 1)
    {
      poVar2 = std::operator<<(out,pcVar3);
      poVar2 = std::operator<<(poVar2,(string *)pLVar4);
      std::operator<<(poVar2,"=\"");
      WriteValue(out,&pLVar4->value);
      std::operator<<(out,"\"");
      pcVar3 = ",";
    }
    if (extraLabelName->_M_string_length != 0) {
      poVar2 = std::operator<<(out,pcVar3);
      poVar2 = std::operator<<(poVar2,(string *)extraLabelName);
      std::operator<<(poVar2,"=\"");
      WriteValue(out,*extraLabelValue);
      std::operator<<(out,"\"");
    }
    std::operator<<(out,"}");
  }
  std::operator<<(out," ");
  return;
}

Assistant:

void WriteHead(std::ostream& out, const MetricFamily& family,
               const ClientMetric& metric, const std::string& suffix = "",
               const std::string& extraLabelName = "",
               const T& extraLabelValue = T()) {
  out << family.name << suffix;
  if (!metric.label.empty() || !extraLabelName.empty()) {
    out << "{";
    const char* prefix = "";

    for (auto& lp : metric.label) {
      out << prefix << lp.name << "=\"";
      WriteValue(out, lp.value);
      out << "\"";
      prefix = ",";
    }
    if (!extraLabelName.empty()) {
      out << prefix << extraLabelName << "=\"";
      WriteValue(out, extraLabelValue);
      out << "\"";
    }
    out << "}";
  }
  out << " ";
}